

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_pack_dev.c
# Opt level: O2

dev_t pack_native(int n,unsigned_long *numbers,char **error)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  ulonglong __dev;
  char *pcVar4;
  
  if (n == 2) {
    uVar1 = *numbers;
    uVar2 = numbers[1];
    __dev = gnu_dev_makedev((uint)uVar1,(uint)uVar2);
    uVar3 = gnu_dev_major(__dev);
    if (uVar1 == uVar3) {
      uVar3 = gnu_dev_minor(__dev);
      if (uVar2 == uVar3) {
        return __dev;
      }
      pcVar4 = "invalid minor number";
    }
    else {
      pcVar4 = "invalid major number";
    }
  }
  else {
    pcVar4 = "too many fields for format";
    __dev = 0;
  }
  *error = pcVar4;
  return __dev;
}

Assistant:

dev_t
pack_native(int n, unsigned long numbers[], const char **error)
{
	dev_t dev = 0;

	if (n == 2) {
		dev = apd_makedev(numbers[0], numbers[1]);
		if ((unsigned long)major(dev) != numbers[0])
			*error = iMajorError;
		else if ((unsigned long)minor(dev) != numbers[1])
			*error = iMinorError;
	} else
		*error = tooManyFields;
	return (dev);
}